

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessAtomics
          (ConversionStream *this,iterator *ScopeStart,iterator *ScopeEnd)

{
  HashMapStringKey *pHVar1;
  HLSL2GLSLConverterImpl *pHVar2;
  _List_node_base *p_Var3;
  int iVar4;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> __position;
  ConversionStream *pCVar5;
  __node_base_ptr p_Var6;
  HLSLObjectInfo *pHVar7;
  const_iterator cVar8;
  int iVar9;
  bool bVar10;
  string err;
  Uint32 NumArguments;
  iterator OperationToken;
  iterator ArgsListEndToken;
  String *in_stack_ffffffffffffff38;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_b8;
  String local_b0;
  ConversionStream *local_90;
  FunctionStubHashKey local_88;
  Uint32 local_54;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_50;
  iterator local_48;
  TokenListType *local_40;
  iterator *local_38;
  
  local_b8._M_node = ScopeStart->_M_node;
  if (ScopeEnd->_M_node != local_b8._M_node) {
    local_40 = &this->m_Tokens;
    local_90 = this;
    local_38 = ScopeStart;
    do {
      if (*(int *)&local_b8._M_node[1]._M_next == 0x13b) {
        pHVar2 = local_90->m_Converter;
        HashMapStringKey::HashMapStringKey
                  (&local_88.Object,(Char *)local_b8._M_node[1]._M_prev,false);
        p_Var6 = std::
                 _Hashtable<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::_M_find_before_node
                           (&(pHVar2->m_AtomicOperations)._M_h,
                            (local_88.Object.Ownership_Hash & 0x7fffffffffffffff) %
                            (pHVar2->m_AtomicOperations)._M_h._M_bucket_count,&local_88.Object,
                            local_88.Object.Ownership_Hash & 0x7fffffffffffffff);
        if (p_Var6 == (__node_base_ptr)0x0) {
          bVar10 = true;
        }
        else {
          bVar10 = p_Var6->_M_nxt == (_Hash_node_base *)0x0;
        }
        pHVar1 = &local_88.Function;
        if ((local_88.Object.Str != (Char *)0x0) && ((long)local_88.Object.Ownership_Hash < 0)) {
          operator_delete__(local_88.Object.Str);
        }
        if (bVar10) goto LAB_001f513b;
        local_50._M_node = local_b8._M_node;
        local_b8._M_node = (local_b8._M_node)->_M_next;
        if (local_b8._M_node == ScopeEnd->_M_node) {
          FormatString<char[15]>((string *)&local_88,(char (*) [15])"Unexpected EOF");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_b0,local_90,&local_b8,4);
          in_stack_ffffffffffffff38 = &local_b0;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessAtomics",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x8c4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_88,(char (*) [2])0x33bd33,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
            operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
          }
        }
        if (*(int *)&local_b8._M_node[1]._M_next != 0x135) {
          FormatString<char[25]>((string *)&local_88,(char (*) [25])"Open bracket is expected");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_b0,local_90,&local_b8,4);
          in_stack_ffffffffffffff38 = &local_b0;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessAtomics",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x8c5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_88,(char (*) [2])0x33bd33,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
            operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
          }
        }
        local_48._M_node = local_b8._M_node;
        local_54 = CountFunctionArguments(local_90,&local_48,ScopeEnd);
        if (local_48._M_node == ScopeEnd->_M_node) {
          FormatString<char[15]>((string *)&local_88,(char (*) [15])"Unexpected EOF");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_b0,local_90,&local_48,4);
          in_stack_ffffffffffffff38 = &local_b0;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessAtomics",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x8cc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_88,(char (*) [2])0x33bd33,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
            operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
          }
        }
        local_b8._M_node = (local_b8._M_node)->_M_next;
        if (local_b8._M_node == ScopeEnd->_M_node) {
          FormatString<char[15]>((string *)&local_88,(char (*) [15])"Unexpected EOF");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_b0,local_90,&local_b8,4);
          in_stack_ffffffffffffff38 = &local_b0;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessAtomics",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x8cf,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_88,(char (*) [2])0x33bd33,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
            operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
          }
        }
        pCVar5 = local_90;
        pHVar7 = FindHLSLObject(local_90,(String *)&local_b8._M_node[1]._M_prev);
        pHVar2 = pCVar5->m_Converter;
        if (pHVar7 == (HLSLObjectInfo *)0x0) {
          FunctionStubHashKey::FunctionStubHashKey
                    (&local_88,"shared_var",(Char *)local_50._M_node[1]._M_prev,local_54);
          cVar8 = std::
                  _Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)pHVar2,&local_88);
          if ((local_88.Function.Str != (Char *)0x0) && ((long)local_88.Function.Ownership_Hash < 0)
             ) {
            operator_delete__(local_88.Function.Str);
          }
          local_88.Function.Str = (Char *)0x0;
          local_88.Function.Ownership_Hash = 0;
          if ((local_88.Object.Str != (Char *)0x0) && ((long)local_88.Object.Ownership_Hash < 0)) {
            operator_delete__(local_88.Object.Str);
          }
          if (cVar8.
              super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
              ._M_cur == (__node_type *)0x0) {
            FormatString<char[43],std::__cxx11::string,char[7],unsigned_int,char[11]>
                      ((string *)&local_88,(Diligent *)"Unable to find function stub for function ",
                       (char (*) [43])&local_50._M_node[1]._M_prev,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33e47e
                       ,(char (*) [7])&local_54,(uint *)" arguments",
                       (char (*) [11])in_stack_ffffffffffffff38);
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_b0,local_90,&local_50,4);
            in_stack_ffffffffffffff38 = &local_b0;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x909,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_88,(char (*) [2])0x33bd33,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
              operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
            }
          }
        }
        else {
          FunctionStubHashKey::FunctionStubHashKey
                    (&local_88,"image",(Char *)local_50._M_node[1]._M_prev,local_54);
          cVar8 = std::
                  _Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)pHVar2,&local_88);
          if ((local_88.Function.Str != (Char *)0x0) && ((long)local_88.Function.Ownership_Hash < 0)
             ) {
            operator_delete__(local_88.Function.Str);
          }
          local_88.Function.Str = (Char *)0x0;
          local_88.Function.Ownership_Hash = 0;
          if ((local_88.Object.Str != (Char *)0x0) && ((long)local_88.Object.Ownership_Hash < 0)) {
            operator_delete__(local_88.Object.Str);
          }
          if (cVar8.
              super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
              ._M_cur == (__node_type *)0x0) {
            FormatString<char[43],std::__cxx11::string,char[7],unsigned_int,char[11]>
                      ((string *)&local_88,(Diligent *)"Unable to find function stub for function ",
                       (char (*) [43])&local_50._M_node[1]._M_prev,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33e47e
                       ,(char (*) [7])&local_54,(uint *)" arguments",
                       (char (*) [11])in_stack_ffffffffffffff38);
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_b0,local_90,&local_50,4);
            in_stack_ffffffffffffff38 = &local_b0;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x8d7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_88,(char (*) [2])0x33bd33,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
              operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
            }
          }
          p_Var3 = ScopeEnd->_M_node;
          bVar10 = local_b8._M_node != p_Var3;
          if (bVar10) {
            iVar9 = 1;
            while ((iVar9 != 1 ||
                   ((*(int *)&local_b8._M_node[1]._M_next != 0x136 &&
                    (*(int *)&local_b8._M_node[1]._M_next != 0x13f))))) {
              iVar4 = -(uint)(*(int *)&local_b8._M_node[1]._M_next == 0x136);
              if (*(int *)&local_b8._M_node[1]._M_next == 0x135) {
                iVar4 = 1;
              }
              local_b8._M_node = (local_b8._M_node)->_M_next;
              bVar10 = local_b8._M_node != p_Var3;
              if ((local_b8._M_node == p_Var3) || (iVar9 = iVar9 + iVar4, iVar9 == 0)) break;
            }
          }
          if (!bVar10) {
            FormatString<char[15]>((string *)&local_88,(char (*) [15])"Unexpected EOF");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_b0,local_90,&local_b8,4);
            in_stack_ffffffffffffff38 = &local_b0;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x8ea,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_88,(char (*) [2])0x33bd33,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
              operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
            }
          }
          if (*(int *)&local_b8._M_node[1]._M_next != 0x13f) {
            FormatString<char[18]>((string *)&local_88,(char (*) [18])"Comma is expected");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_b0,local_90,&local_b8,4);
            in_stack_ffffffffffffff38 = &local_b0;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x8eb,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_88,(char (*) [2])0x33bd33,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
              operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
            }
          }
          local_b8._M_node = (local_b8._M_node)->_M_prev;
          if (*(int *)&local_b8._M_node[1]._M_next != 0x138) {
            FormatString<char[13]>((string *)&local_88,(char (*) [13])"Expected \']\'");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_b0,local_90,&local_b8,4);
            in_stack_ffffffffffffff38 = &local_b0;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x8f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_88,(char (*) [2])0x33bd33,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
              operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
            }
          }
          __position._M_node = local_b8._M_node;
          local_b8._M_node = (local_b8._M_node)->_M_prev;
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::_M_erase(local_40,(iterator)__position._M_node);
          bVar10 = local_b8._M_node == local_38->_M_node;
          if (bVar10) {
LAB_001f58b9:
            FormatString<char[13]>((string *)&local_88,(char (*) [13])"Expected \'[\'");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_b0,local_90,&local_b8,4);
            in_stack_ffffffffffffff38 = &local_b0;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x8fb,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_88,(char (*) [2])0x33bd33,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
              operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
            }
          }
          else {
            iVar9 = *(int *)&local_b8._M_node[1]._M_next;
            while (iVar9 != 0x137) {
              local_b8._M_node = (local_b8._M_node)->_M_prev;
              bVar10 = local_b8._M_node == local_38->_M_node;
              if (bVar10) goto LAB_001f58b9;
              iVar9 = *(int *)&local_b8._M_node[1]._M_next;
            }
            if (bVar10) goto LAB_001f58b9;
          }
          *(undefined4 *)&local_b8._M_node[1]._M_next = 0x13f;
          std::__cxx11::string::_M_replace
                    ((ulong)&local_b8._M_node[1]._M_prev,0,(char *)local_b8._M_node[2]._M_next,
                     0x360eb0);
        }
        std::__cxx11::string::_M_assign((string *)&local_50._M_node[1]._M_prev);
        local_b8._M_node = local_48._M_node;
      }
      else {
LAB_001f513b:
        local_b8._M_node = (local_b8._M_node)->_M_next;
      }
    } while (local_b8._M_node != ScopeEnd->_M_node);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessAtomics(const TokenListType::iterator& ScopeStart,
                                                              const TokenListType::iterator& ScopeEnd)
{
    auto Token = ScopeStart;
    while (Token != ScopeEnd)
    {
        if (Token->Type == TokenType::Identifier)
        {
            auto AtomicIt = m_Converter.m_AtomicOperations.find(Token->Literal.c_str());
            if (AtomicIt == m_Converter.m_AtomicOperations.end())
            {
                ++Token;
                continue;
            }

            auto OperationToken = Token;
            // InterlockedAdd(g_i4SharedArray[GTid.x].x, 1, iOldVal);
            // ^
            ++Token;
            // InterlockedAdd(g_i4SharedArray[GTid.x].x, 1, iOldVal);
            //               ^
            VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unexpected EOF");
            VERIFY_PARSER_STATE(Token, Token->Type == TokenType::OpenParen, "Open bracket is expected");

            auto ArgsListEndToken = Token;
            auto NumArguments     = CountFunctionArguments(ArgsListEndToken, ScopeEnd);
            // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
            //                                           ^
            //                                       ArgsListEndToken
            VERIFY_PARSER_STATE(ArgsListEndToken, ArgsListEndToken != ScopeEnd, "Unexpected EOF");

            ++Token;
            VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unexpected EOF");

            const auto* pObjectInfo = FindHLSLObject(Token->Literal);
            if (pObjectInfo != nullptr)
            {
                // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
                //                ^
                auto StubIt = m_Converter.m_GLSLStubs.find(FunctionStubHashKey("image", OperationToken->Literal.c_str(), NumArguments));
                VERIFY_PARSER_STATE(OperationToken, StubIt != m_Converter.m_GLSLStubs.end(), "Unable to find function stub for function ", OperationToken->Literal, " with ", NumArguments, " arguments");

                // Find first comma
                int NumOpenBrackets = 1;
                while (Token != ScopeEnd && NumOpenBrackets != 0)
                {
                    // Do not count arguments of nested functions:
                    if (NumOpenBrackets == 1 && (Token->Type == TokenType::Comma || Token->Type == TokenType::ClosingParen))
                        break;

                    if (Token->Type == TokenType::OpenParen)
                        ++NumOpenBrackets;
                    else if (Token->Type == TokenType::ClosingParen)
                        --NumOpenBrackets;

                    ++Token;
                }
                // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
                //                              ^
                VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unexpected EOF");
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Comma, "Comma is expected");

                --Token;
                // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
                //                             ^
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::ClosingSquareBracket, "Expected \']\'");
                auto ClosingBracketToken = Token;
                --Token;
                m_Tokens.erase(ClosingBracketToken);
                // InterlockedAdd(Tex2D[GTid.xy, 1, iOldVal);
                //                           ^
                while (Token != ScopeStart && Token->Type != TokenType::OpenSquareBracket)
                    --Token;
                // InterlockedAdd(Tex2D[GTid.xy, 1, iOldVal);
                //                     ^

                VERIFY_PARSER_STATE(Token, Token != ScopeStart, "Expected \'[\'");
                Token->Type    = TokenType::Comma;
                Token->Literal = ",";
                // InterlockedAdd(Tex2D,GTid.xy, 1, iOldVal);
                //                     ^

                OperationToken->Literal = StubIt->second.Name;
                // InterlockedAddImage_3(Tex2D,GTid.xy, 1, iOldVal);
            }
            else
            {
                // InterlockedAdd(g_i4SharedArray[GTid.x].x, 1, iOldVal);
                //                ^
                auto StubIt = m_Converter.m_GLSLStubs.find(FunctionStubHashKey("shared_var", OperationToken->Literal.c_str(), NumArguments));
                VERIFY_PARSER_STATE(OperationToken, StubIt != m_Converter.m_GLSLStubs.end(), "Unable to find function stub for function ", OperationToken->Literal, " with ", NumArguments, " arguments");
                OperationToken->Literal = StubIt->second.Name;
                // InterlockedAddSharedVar_3(g_i4SharedArray[GTid.x].x, 1, iOldVal);
            }
            Token = ArgsListEndToken;
        }
        else
            ++Token;
    }
}